

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::EpsCopyInputStream::ParseEndsInSlopRegion
          (EpsCopyInputStream *this,char *begin,int overrun,int depth)

{
  undefined1 auVar1 [12];
  bool bVar2;
  char cVar3;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar4;
  string *psVar5;
  string *extraout_RAX_01;
  byte bVar6;
  ZeroCopyInputStream *pZVar7;
  Cord *pCVar8;
  uint uVar9;
  uint extraout_EDX;
  int extraout_EDX_00;
  uint extraout_EDX_01;
  size_t __n;
  char **ppcVar10;
  long *__dest;
  int iVar11;
  ZeroCopyInputStream *pZVar12;
  uint uVar13;
  long lVar14;
  EpsCopyInputStream *pEVar15;
  EpsCopyInputStream *this_00;
  undefined1 *puVar16;
  undefined1 *puVar17;
  EpsCopyInputStream *this_01;
  long *plVar18;
  char *unaff_R12;
  int unaff_R13D;
  int iVar19;
  char *pcVar20;
  char *pcVar21;
  ulong uVar22;
  pair<const_char_*,_int> pVar23;
  int iStack_10c;
  long *plStack_108;
  EpsCopyInputStream *pEStack_100;
  char *pcStack_f8;
  long alStack_f0 [2];
  char *pcStack_e0;
  char *pcStack_d8;
  char *pcStack_a0;
  EpsCopyInputStream *pEStack_98;
  ZeroCopyInputStream *pZStack_90;
  undefined1 auStack_88 [16];
  EpsCopyInputStream *pEStack_78;
  undefined1 auStack_50 [40];
  
  pEVar15 = (EpsCopyInputStream *)(auStack_50 + 0x18);
  iVar19 = (int)begin;
  pZVar12 = (ZeroCopyInputStream *)((ulong)begin & 0xffffffff);
  if (iVar19 < 0) {
    auStack_50._16_8_ = (char *)0x17464c;
    psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar19,0,"overrun >= 0");
  }
  else {
    psVar4 = (string *)0x0;
  }
  if (psVar4 == (string *)0x0) {
    if (iVar19 < 0x11) {
      psVar4 = (string *)0x0;
    }
    else {
      auStack_50._16_8_ = (char *)0x174664;
      psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((ulong)begin & 0xffffffff,0x10,"overrun <= kSlopBytes");
    }
    if (psVar4 == (string *)0x0) {
      ppcVar10 = &this->next_chunk_;
      pcVar21 = this->patch_buffer_ + (long)iVar19 + -0x28;
      do {
        if (ppcVar10 <= pcVar21) {
          bVar6 = 0;
          break;
        }
        bVar6 = *pcVar21;
        pcVar20 = pcVar21 + 1;
        uVar9 = (uint)bVar6;
        if ((char)bVar6 < '\0') {
          uVar13 = ((uint)bVar6 + (uint)(byte)*pcVar20 * 0x80) - 0x80;
          if (*pcVar20 < '\0') {
            lVar14 = -0x15;
            pcVar21 = pcVar21 + 3;
            do {
              pcVar20 = pcVar21;
              uVar13 = ((byte)pcVar20[-1] - 1 << ((char)lVar14 + 0x23U & 0x1f)) + uVar13;
              uVar9 = uVar13;
              if (-1 < pcVar20[-1]) break;
              pcVar21 = pcVar20 + 1;
              pcVar20 = (char *)0x0;
              lVar14 = lVar14 + 7;
              uVar9 = 0;
            } while (lVar14 != 0);
          }
          else {
            pcVar20 = pcVar21 + 2;
            uVar9 = uVar13;
          }
        }
        if (ppcVar10 < pcVar20 || pcVar20 == (char *)0x0) {
switchD_00174528_default:
          bVar2 = false;
          pZVar7 = (ZeroCopyInputStream *)0x0;
        }
        else {
          pZVar7 = (ZeroCopyInputStream *)0x1;
          if (uVar9 == 0) {
LAB_001745f4:
            bVar2 = false;
          }
          else {
            iVar19 = overrun;
            switch(uVar9 & 7) {
            case 0:
              if (*pcVar20 < '\0') {
                lVar14 = 9;
                pcVar21 = pcVar20 + 2;
                do {
                  pcVar20 = pcVar21;
                  if (-1 < pcVar20[-1]) break;
                  pcVar21 = pcVar20 + 1;
                  pcVar20 = (char *)0x0;
                  lVar14 = lVar14 + -1;
                } while (lVar14 != 0);
              }
              else {
                pcVar20 = pcVar20 + 1;
              }
              bVar6 = pcVar20 != (char *)0x0 & (byte)pZVar12;
              pZVar7 = (ZeroCopyInputStream *)(ulong)bVar6;
              if (pcVar20 == (char *)0x0) goto LAB_001745f4;
              pZVar12 = (ZeroCopyInputStream *)(ulong)bVar6;
              break;
            case 1:
              pcVar20 = pcVar20 + 8;
              break;
            case 2:
              bVar6 = *pcVar20;
              if ((char)bVar6 < '\0') {
                auStack_50._16_8_ = (char *)0x174622;
                pVar23 = ReadSizeFallback(pcVar20,(uint)bVar6);
                auVar1 = pVar23._0_12_;
              }
              else {
                auVar1[8] = bVar6;
                auVar1._0_8_ = pcVar20 + 1;
                auVar1._9_3_ = 0;
              }
              pcVar20 = auVar1._0_8_;
              if ((pcVar20 == (char *)0x0) || ((long)ppcVar10 - (long)pcVar20 < (long)auVar1._8_4_))
              {
                bVar2 = false;
                pZVar7 = (ZeroCopyInputStream *)0x0;
              }
              else {
                pcVar20 = pcVar20 + auVar1._8_4_;
                bVar2 = true;
                pZVar7 = pZVar12;
              }
              pZVar12 = pZVar7;
              if (!bVar2) {
                bVar2 = false;
                goto LAB_00174605;
              }
              break;
            case 3:
              iVar19 = overrun + 1;
              break;
            case 4:
              iVar19 = overrun + -1;
              if (overrun < 1) {
                bVar2 = false;
                overrun = iVar19;
                goto LAB_00174605;
              }
              break;
            case 5:
              pcVar20 = pcVar20 + 4;
              break;
            default:
              goto switchD_00174528_default;
            }
            pZVar7 = pZVar12;
            bVar2 = true;
            overrun = iVar19;
          }
        }
LAB_00174605:
        bVar6 = (byte)pZVar7;
        pZVar12 = pZVar7;
        pcVar21 = pcVar20;
      } while (bVar2);
      return (bool)(bVar6 & 1);
    }
  }
  else {
    auStack_50._16_8_ = (char *)0x174674;
    ParseEndsInSlopRegion();
    psVar4 = extraout_RAX;
  }
  auStack_50._16_8_ = (char *)0x17467f;
  ParseEndsInSlopRegion();
  this_00 = (EpsCopyInputStream *)auStack_50;
  auStack_50._16_8_ = this;
  if (0x10 < pEVar15->limit_) {
    pcVar20 = NextBuffer(pEVar15,0,-1);
    pcVar21 = pEVar15->buffer_end_;
    if (pcVar20 == (char *)0x0) {
      pEVar15->limit_end_ = pcVar21;
      pEVar15->last_tag_minus_1_ = 1;
      pcVar20 = (char *)0x0;
    }
    else {
      uVar9 = ((int)pcVar20 - (int)pcVar21) + pEVar15->limit_;
      pEVar15->limit_ = uVar9;
      pEVar15->limit_end_ = pcVar21 + (int)((int)uVar9 >> 0x1f & uVar9);
    }
    return SUB81(pcVar20,0);
  }
  Next((EpsCopyInputStream *)auStack_50);
  puVar17 = auStack_88;
  puVar16 = auStack_88;
  pEVar15 = (EpsCopyInputStream *)auStack_88;
  uVar9 = this_00->limit_;
  uVar13 = (uint)psVar4;
  if ((int)uVar9 < (int)uVar13) {
LAB_001747e9:
    pcVar21 = (char *)0x0;
    goto LAB_001747da;
  }
  uVar22 = (ulong)psVar4 & 0xffffffff;
  pEStack_78 = this;
  if (uVar9 == uVar13) {
    pZStack_90 = (ZeroCopyInputStream *)0x1747f5;
    DoneFallback((EpsCopyInputStream *)auStack_88);
LAB_001747f5:
    pZStack_90 = (ZeroCopyInputStream *)0x1747fd;
    DoneFallback((EpsCopyInputStream *)auStack_88);
LAB_001747fd:
    pZStack_90 = (ZeroCopyInputStream *)0x174805;
    DoneFallback((EpsCopyInputStream *)auStack_88);
LAB_00174805:
    pZStack_90 = (ZeroCopyInputStream *)0x174813;
    psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)puVar17,0,"limit_ > 0");
  }
  else {
    if ((int)uVar9 <= (int)uVar13) goto LAB_001747f5;
    if (this_00->limit_end_ != this_00->buffer_end_ + (int)((int)uVar9 >> 0x1f & uVar9))
    goto LAB_001747fd;
    pZVar12 = (ZeroCopyInputStream *)(ulong)extraout_EDX;
    puVar17 = (undefined1 *)(long)(int)uVar9;
    if ((int)uVar9 < 1) goto LAB_00174805;
    psVar4 = (string *)0x0;
  }
  if (psVar4 == (string *)0x0) {
    if (this_00->limit_end_ == this_00->buffer_end_) {
      unaff_R12 = "overrun >= 0";
      do {
        iVar19 = (int)uVar22;
        if (iVar19 < 0) {
          pZStack_90 = (ZeroCopyInputStream *)0x17479c;
          psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                             ((long)iVar19,0,"overrun >= 0");
        }
        else {
          psVar4 = (string *)0x0;
        }
        if (psVar4 != (string *)0x0) {
          pZStack_90 = (ZeroCopyInputStream *)0x17483e;
          DoneFallback();
          goto LAB_0017483e;
        }
        pZStack_90 = (ZeroCopyInputStream *)0x174767;
        pcVar21 = NextBuffer(this_00,iVar19,(int)pZVar12);
        if (pcVar21 == (char *)0x0) {
          if (iVar19 != 0) goto LAB_001747e9;
          puVar16 = (undefined1 *)(long)this_00->limit_;
          if ((long)puVar16 < 1) goto LAB_00174820;
          psVar4 = (string *)0x0;
          goto LAB_001747ae;
        }
        iVar11 = (int)this_00->buffer_end_;
        uVar9 = ((int)pcVar21 - iVar11) + this_00->limit_;
        this_00->limit_ = uVar9;
        pcVar21 = pcVar21 + iVar19;
        uVar13 = (int)pcVar21 - iVar11;
        uVar22 = (ulong)uVar13;
      } while (-1 < (int)uVar13);
      this_00->limit_end_ = this_00->buffer_end_ + (int)((int)uVar9 >> 0x1f & uVar9);
LAB_001747da:
      return SUB81(pcVar21,0);
    }
    pZStack_90 = (ZeroCopyInputStream *)0x174820;
    DoneFallback((EpsCopyInputStream *)auStack_88);
LAB_00174820:
    pZStack_90 = (ZeroCopyInputStream *)0x17482e;
    psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)puVar16,0,"limit_ > 0");
LAB_001747ae:
    if (psVar4 == (string *)0x0) {
      pcVar21 = this_00->buffer_end_;
      this_00->limit_end_ = pcVar21;
      this_00->last_tag_minus_1_ = 1;
      goto LAB_001747da;
    }
  }
  else {
LAB_0017483e:
    pZStack_90 = (ZeroCopyInputStream *)0x174849;
    DoneFallback();
    psVar4 = extraout_RAX_00;
  }
  pZStack_90 = (ZeroCopyInputStream *)SkipFallback;
  DoneFallback();
  this_01 = (EpsCopyInputStream *)&stack0xffffffffffffff50;
  uVar9 = (*(int *)&pEVar15->buffer_end_ - (int)psVar4) + 0x10;
  pcStack_a0 = (char *)CONCAT71((int7)((ulong)this >> 8),1);
  pEStack_98 = this_00;
  pZStack_90 = pZVar12;
  iVar19 = extraout_EDX_00;
  while( true ) {
    pCVar8 = (Cord *)(ulong)uVar9;
    iVar11 = iVar19 - uVar9;
    if (iVar11 == 0 || iVar19 < (int)uVar9) break;
    if (pEVar15->next_chunk_ == (char *)0x0) {
      return false;
    }
    if (pEVar15->limit_ < 0x11) {
      return false;
    }
    pcVar21 = Next(pEVar15);
    if (pcVar21 == (char *)0x0) {
      return false;
    }
    uVar9 = (*(int *)&pEVar15->buffer_end_ - (int)(pcVar21 + 0x10)) + 0x10;
    iVar19 = iVar11;
    if (iVar11 <= (int)uVar9) {
      return (bool)((char)(pcVar21 + 0x10) + (char)iVar11);
    }
  }
  SkipFallback((EpsCopyInputStream *)&stack0xffffffffffffff50);
  pcStack_e0 = (char *)0x0;
  iVar19 = (int)this_01->buffer_end_;
  iVar11 = iVar19 - (int)psVar4;
  pcStack_d8 = unaff_R12;
  if (this_01->zcis_ == (ZeroCopyInputStream *)0x0) {
    if (iVar11 + 0x10 < (int)extraout_EDX_01) {
      iVar19 = (iVar19 - (int)psVar4) + 0x10;
      uVar9 = extraout_EDX_01;
      do {
        uVar13 = uVar9 - iVar19;
        if (uVar13 == 0 || (int)uVar9 < iVar19) {
          pEStack_100 = (EpsCopyInputStream *)0x174aba;
          ReadCordFallback((EpsCopyInputStream *)alStack_f0);
          pcVar21 = unaff_R12;
          goto LAB_00174aba;
        }
        if (this_01->next_chunk_ == (char *)0x0) goto LAB_00174a8a;
        pEStack_100 = (EpsCopyInputStream *)0x1749bd;
        absl::lts_20240722::Cord::InlineRep::AppendArray(pCVar8,(long)iVar19,psVar4,4);
        if (this_01->limit_ < 0x11) goto LAB_00174a8a;
        pEStack_100 = (EpsCopyInputStream *)0x1749cf;
        pcVar21 = Next(this_01);
        if (pcVar21 == (char *)0x0) goto LAB_00174a8a;
        psVar4 = (string *)(pcVar21 + 0x10);
        iVar19 = (*(int *)&this_01->buffer_end_ - (int)psVar4) + 0x10;
        uVar9 = uVar13;
      } while (iVar19 < (int)uVar13);
      lVar14 = (long)(int)uVar13;
      pEStack_100 = (EpsCopyInputStream *)0x174a02;
      absl::lts_20240722::Cord::InlineRep::AppendArray(pCVar8,lVar14,psVar4,4);
    }
    else {
      lVar14 = (long)(int)extraout_EDX_01;
      pEStack_100 = (EpsCopyInputStream *)0x174a15;
      absl::lts_20240722::Cord::operator=(pCVar8,lVar14,psVar4);
    }
    psVar4 = psVar4 + lVar14;
    goto LAB_00174a8d;
  }
  iVar19 = this_01->limit_ + iVar11;
  unaff_R13D = iVar19 - extraout_EDX_01;
  if ((int)extraout_EDX_01 <= iVar19) {
    uVar9 = iVar11 + 0x10;
    pcVar21 = (char *)(ulong)uVar9;
    pcVar20 = this_01->patch_buffer_;
    uVar13 = extraout_EDX_01;
    if ((int)uVar9 < 0x21 && (ulong)((long)psVar4 - (long)pcVar20) < 0x21) {
      if ((iVar11 == 0) && (this_01->next_chunk_ != pcVar20 && this_01->next_chunk_ != (char *)0x0))
      {
        pEStack_100 = (EpsCopyInputStream *)0x174aa7;
        absl::lts_20240722::Cord::Clear();
        pcVar21 = (char *)(ulong)(uint)this_01->size_;
        goto LAB_00174a22;
      }
      uVar13 = extraout_EDX_01 - uVar9;
      pcStack_f8 = pcVar20;
      if (uVar13 == 0 || (int)extraout_EDX_01 < (int)uVar9) {
LAB_00174aba:
        uVar9 = (uint)pcVar21;
        pEStack_100 = (EpsCopyInputStream *)0x174acb;
        psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           ((long)(int)uVar13,0,"size > 0");
      }
      else {
        psVar5 = (string *)0x0;
      }
      if (psVar5 != (string *)0x0) {
LAB_00174ada:
        plVar18 = alStack_f0;
        pEStack_100 = (EpsCopyInputStream *)0x174ae7;
        ReadCordFallback();
        pEStack_100 = this_01;
        plVar18[4] = (long)psVar5;
        *(undefined4 *)((long)plVar18 + 0x1c) = 0x7fffffff;
        cVar3 = (**(code **)(*(long *)psVar5 + 0x10))(psVar5,&plStack_108,&iStack_10c);
        if (cVar3 == '\0') {
          *(undefined4 *)((long)plVar18 + 0x54) = 0;
          plVar18[2] = 0;
          *(undefined4 *)(plVar18 + 3) = 0;
          __dest = plVar18 + 5;
          plVar18[1] = (long)__dest;
          *plVar18 = (long)__dest;
        }
        else {
          __n = (size_t)iStack_10c;
          *(int *)((long)plVar18 + 0x54) = *(int *)((long)plVar18 + 0x54) - iStack_10c;
          if ((long)__n < 0x11) {
            plVar18[1] = (long)(plVar18 + 7);
            *plVar18 = (long)(plVar18 + 7);
            plVar18[2] = (long)(plVar18 + 5);
            __dest = (long *)((long)plVar18 + (0x48 - __n));
            memcpy(__dest,plStack_108,__n);
          }
          else {
            *(int *)((long)plVar18 + 0x1c) = (*(int *)((long)plVar18 + 0x1c) - iStack_10c) + 0x10;
            lVar14 = (long)plStack_108 + (__n - 0x10);
            plVar18[1] = lVar14;
            *plVar18 = lVar14;
            plVar18[2] = (long)(plVar18 + 5);
            __dest = plStack_108;
            if (plVar18[9] == 1) {
              plVar18[9] = 2;
            }
          }
        }
        return SUB81(__dest,0);
      }
      pEStack_100 = (EpsCopyInputStream *)0x17495c;
      absl::lts_20240722::Cord::operator=(pCVar8,(long)(int)uVar9,psVar4);
      if (this_01->next_chunk_ != pcStack_f8) {
        if (this_01->next_chunk_ == (char *)0x0) {
          this_01->last_tag_minus_1_ = 1;
          goto LAB_00174a8a;
        }
        if (this_01->size_ < 0x11) {
          pEStack_100 = (EpsCopyInputStream *)0x174ada;
          ReadCordFallback((EpsCopyInputStream *)alStack_f0);
          psVar5 = extraout_RAX_01;
          goto LAB_00174ada;
        }
        pcVar21 = (char *)(ulong)(this_01->size_ - 0x10);
        goto LAB_00174a22;
      }
    }
    else {
      pEStack_100 = (EpsCopyInputStream *)0x174a22;
      absl::lts_20240722::Cord::Clear();
LAB_00174a22:
      pEStack_100 = (EpsCopyInputStream *)0x174a2f;
      (*this_01->zcis_->_vptr_ZeroCopyInputStream[3])(this_01->zcis_,pcVar21);
      this_01->overall_limit_ = this_01->overall_limit_ + (int)pcVar21;
    }
    if ((int)uVar13 <= this_01->overall_limit_) {
      this_01->overall_limit_ = this_01->overall_limit_ - uVar13;
      pEStack_100 = (EpsCopyInputStream *)0x174a4c;
      iVar19 = (*this_01->zcis_->_vptr_ZeroCopyInputStream[6])(this_01->zcis_,pCVar8,(ulong)uVar13);
      if ((char)iVar19 != '\0') {
        pEStack_100 = (EpsCopyInputStream *)0x174a5c;
        psVar4 = (string *)InitFrom(this_01,this_01->zcis_);
        uVar9 = unaff_R13D + ((int)psVar4 - (int)this_01->buffer_end_);
        this_01->limit_ = uVar9;
        this_01->limit_end_ = this_01->buffer_end_ + (int)((int)uVar9 >> 0x1f & uVar9);
        goto LAB_00174a8d;
      }
    }
  }
LAB_00174a8a:
  psVar4 = (string *)0x0;
LAB_00174a8d:
  return SUB81(psVar4,0);
}

Assistant:

bool EpsCopyInputStream::ParseEndsInSlopRegion(const char* begin, int overrun,
                                               int depth) {
  constexpr int kSlopBytes = EpsCopyInputStream::kSlopBytes;
  ABSL_DCHECK_GE(overrun, 0);
  ABSL_DCHECK_LE(overrun, kSlopBytes);
  auto ptr = begin + overrun;
  auto end = begin + kSlopBytes;
  while (ptr < end) {
    uint32_t tag;
    ptr = ReadTag(ptr, &tag);
    if (ptr == nullptr || ptr > end) return false;
    // ending on 0 tag is allowed and is the major reason for the necessity of
    // this function.
    if (tag == 0) return true;
    switch (tag & 7) {
      case 0: {  // Varint
        uint64_t val;
        ptr = VarintParse(ptr, &val);
        if (ptr == nullptr) return false;
        break;
      }
      case 1: {  // fixed64
        ptr += 8;
        break;
      }
      case 2: {  // len delim
        int32_t size = ReadSize(&ptr);
        if (ptr == nullptr || size > end - ptr) return false;
        ptr += size;
        break;
      }
      case 3: {  // start group
        depth++;
        break;
      }
      case 4: {                    // end group
        if (--depth < 0) return true;  // We exit early
        break;
      }
      case 5: {  // fixed32
        ptr += 4;
        break;
      }
      default:
        return false;  // Unknown wireformat
    }
  }
  return false;
}